

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Query *query)

{
  pointer pQVar1;
  bool bVar2;
  ostream *poVar3;
  vector<Query,_std::allocator<Query>_> *pvVar4;
  runtime_error *this;
  long lVar5;
  char *pcVar6;
  Query *q;
  pointer query_00;
  string local_40;
  
  poVar3 = os;
  switch(query->type) {
  case PRIMITIVE:
    Query::as_string_repr_abi_cxx11_(&local_40,query);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_40._M_dataplus._M_p,local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return os;
    }
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    return os;
  case AND:
    pcVar6 = "and(";
    lVar5 = 4;
    break;
  case OR:
    pcVar6 = "or(";
    lVar5 = 3;
    break;
  case MIN_OF:
    std::__ostream_insert<char,std::char_traits<char>>(os,"min_of(",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    pcVar6 = ", ";
    lVar5 = 2;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unknown query type.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
  pvVar4 = Query::as_queries(query);
  query_00 = (pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pQVar1 = (pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (query_00 != pQVar1) {
    bVar2 = true;
    do {
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      operator<<(os,query_00);
      query_00 = query_00 + 1;
      bVar2 = false;
    } while (query_00 != pQVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Query &query) {
    QueryType type = query.get_type();
    if (type == QueryType::AND || type == QueryType::OR ||
        type == QueryType::MIN_OF) {
        if (type == QueryType::AND) {
            os << "and(";
        } else if (type == QueryType::OR) {
            os << "or(";
        } else if (type == QueryType::MIN_OF) {
            os << "min_of(" << query.as_count() << ", ";
        }

        bool is_first = true;
        for (const auto &q : query.as_queries()) {
            if (!is_first) {
                os << ", ";
            }
            is_first = false;
            os << q;
        }
        os << ")";
    } else if (type == QueryType::PRIMITIVE) {
        os << query.as_string_repr();
    } else {
        throw std::runtime_error("Unknown query type.");
    }
    return os;
}